

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O2

RecyclerTestObject * BarrierObject<1001U,_50000U>::New(void)

{
  uint uVar1;
  Recycler *alloc;
  BarrierObject<1001U,_50000U> *this;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  uVar1 = PAL_rand();
  data.typeinfo = (type_info *)(ulong)((uVar1 % 49000) * 8 + 0x1f48);
  local_40 = (undefined1  [8])&BarrierObject<1001u,50000u>::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_424f;
  data.filename._0_4_ = 0xde;
  alloc = Memory::Recycler::TrackAllocInfo(recyclerInstance,(TrackAllocData *)local_40);
  this = (BarrierObject<1001U,_50000U> *)new<Memory::Recycler>(0x18,alloc,0x1e7846,0);
  BarrierObject(this,uVar1 % 49000 + 0x3e9);
  return &this->super_RecyclerTestObject;
}

Assistant:

static RecyclerTestObject * New()
    {
        unsigned int count = minCount + GetRandomInteger(maxCount - minCount + 1);

        return RecyclerNewWithBarrierPlus(recyclerInstance, sizeof(RecyclerTestObject *) * count, BarrierObject, count);
    }